

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_markers.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  uint64_t uVar2;
  CURLcode CVar3;
  long lVar4;
  ostream *poVar5;
  uint64_t uVar6;
  ulong number;
  char *pcVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_R9;
  uint64_t uVar8;
  ulong uVar9;
  ulong uVar10;
  uint64_t uVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  string local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  string uri_vtt;
  string uri;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vtt_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> segment_bytes;
  push_marker_options_t opts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_bytes_vtt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_bytes;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  in_emsg_list;
  string vtt_track;
  string out_meta;
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  in_vtt_list;
  string event_track;
  fstream oft_vtt;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440 [32];
  fstream oft;
  char local_230 [512];
  
  push_marker_options_t::push_marker_options_t(&opts);
  push_marker_options_t::parse_options(&opts,argc,argv);
  if ((opts.send_event_ == false) && (opts.send_vtt_ == false)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "not configured to send event track or vtt track, use option --vtt when setting option --no_event"
               ,0x60);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)opts.media_string_._M_dataplus._M_p != &opts.media_string_.field_2) {
      operator_delete(opts.media_string_._M_dataplus._M_p,
                      opts.media_string_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)opts.init_string_._M_dataplus._M_p != &opts.init_string_.field_2) {
      operator_delete(opts.init_string_._M_dataplus._M_p,
                      opts.init_string_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)opts.url_._M_dataplus._M_p != &opts.url_.field_2) {
      operator_delete(opts.url_._M_dataplus._M_p,opts.url_.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  std::operator+(&uri,&opts.url_,"/Streams(out_meta.cmfm)");
  std::operator+(&uri_vtt,&opts.url_,"/Streams(out_vtt.cmft)");
  event_track._M_dataplus._M_p = (pointer)&event_track.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&event_track,"events","");
  vtt_track._M_dataplus._M_p = (pointer)&vtt_track.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vtt_track,"vtt_time","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oft_vtt,
                 &event_track,".cmfm");
  std::fstream::fstream(&oft,(string *)&oft_vtt,_S_out|_S_bin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_oft_vtt != local_440) {
    operator_delete(_oft_vtt,local_440[0]._M_allocated_capacity + 1);
  }
  std::operator+(&out_meta,&vtt_track,".cmft");
  std::fstream::fstream(&oft_vtt,(string *)&out_meta,_S_out|_S_bin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_meta._M_dataplus._M_p != &out_meta.field_2) {
    operator_delete(out_meta._M_dataplus._M_p,out_meta.field_2._M_allocated_capacity + 1);
  }
  header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header_bytes_vtt.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (opts.send_event_ == true) {
    ::event_track::get_meta_header_bytes(opts.track_id_,opts.timescale_,&header_bytes,false);
  }
  if (opts.send_vtt_ == true) {
    ::event_track::get_meta_header_bytes(opts.track_id_ + 1,opts.timescale_,&header_bytes_vtt,true);
  }
  if (opts.dry_run_ == true) {
    if (opts.send_event_ != false) {
      std::ostream::write(local_230,
                          (long)header_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    }
    if (opts.send_vtt_ == true) {
      std::ostream::write(local_440[0]._M_local_buf,
                          (long)header_bytes_vtt.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    if (opts.send_event_ != false) {
      if (opts.init_string_._M_string_length < 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting event segment to: ",0x1a);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,uri._M_dataplus._M_p,uri._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        CVar3 = PostCurlIngestConnection::send_curl_post(&uri,&header_bytes);
        if (CVar3 != CURLE_OK) goto LAB_00106d87;
      }
      else {
        out_meta._M_dataplus._M_p = (pointer)&out_meta.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&out_meta,"events","");
        std::operator+(&local_778,&opts.url_,"/");
        get_path_from_template(&local_758,&opts.init_string_,&out_meta,0,0);
        std::operator+(&local_738,&local_778,&local_758);
        std::__cxx11::string::operator=((string *)&uri,(string *)&local_738);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting event segment to: ",0x1a);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,uri._M_dataplus._M_p,uri._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        CVar3 = PostCurlIngestConnection::send_curl_post(&uri,&header_bytes);
        if (CVar3 != CURLE_OK) goto LAB_00106d87;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out_meta._M_dataplus._M_p != &out_meta.field_2) {
          operator_delete(out_meta._M_dataplus._M_p,out_meta.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (opts.send_vtt_ == true) {
      if (opts.init_string_._M_string_length < 2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting \'vttt segment to: ",0x1a);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,uri_vtt._M_dataplus._M_p,uri_vtt._M_string_length)
        ;
        std::endl<char,std::char_traits<char>>(poVar5);
        CVar3 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&header_bytes_vtt);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting \'vttt segment to: ",0x1a);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,uri_vtt._M_dataplus._M_p,uri_vtt._M_string_length)
        ;
        std::endl<char,std::char_traits<char>>(poVar5);
        std::operator+(&local_738,&opts.url_,"/");
        get_path_from_template(&local_778,&opts.init_string_,&vtt_track,0,0);
        std::operator+(&out_meta,&local_738,&local_778);
        std::__cxx11::string::operator=((string *)&uri_vtt,(string *)&out_meta);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out_meta._M_dataplus._M_p != &out_meta.field_2) {
          operator_delete(out_meta._M_dataplus._M_p,out_meta.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        CVar3 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&header_bytes_vtt);
      }
      if (CVar3 != CURLE_OK) {
LAB_00106d87:
        exit(1);
      }
    }
  }
  uVar9 = 0;
LAB_00106011:
  do {
    lVar4 = std::chrono::_V2::system_clock::now();
    uVar8 = opts.seg_dur_;
    uVar12 = lVar4 / 1000000 + opts.announce_;
    auVar14._8_4_ = (int)(uVar12 >> 0x20);
    auVar14._0_8_ = uVar12;
    auVar14._12_4_ = 0x45300000;
    dVar17 = (auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0);
    auVar15._8_4_ = (int)(opts.seg_dur_ >> 0x20);
    auVar15._0_8_ = opts.seg_dur_;
    auVar15._12_4_ = 0x45300000;
    dVar13 = ceil(dVar17 / ((auVar15._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)opts.seg_dur_) - 4503599627370496.0)));
    uVar2 = opts.avail_dur_;
    uVar11 = opts.avail_interval_;
    number = (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13;
  } while (uVar9 == number);
  auVar16._8_4_ = (int)(opts.avail_interval_ >> 0x20);
  auVar16._0_8_ = opts.avail_interval_;
  auVar16._12_4_ = 0x45300000;
  dVar13 = floor(dVar17 / ((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)opts.avail_interval_) -
                          4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," next_K is : ",0xd);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar5);
  in_emsg_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_emsg_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_emsg_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_vtt_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in_vtt_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in_vtt_list.
  super__Vector_base<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((opts.seg_dur_ != 0 & opts.send_vtt_) == 1) {
    uVar9 = 0;
    uVar10 = 100;
    do {
      uVar6 = opts.seg_dur_ * number + uVar9;
      generate_event_message_vtt_time
                ((DASHEventMessageBoxv1 *)&out_meta,(uint32_t)uVar6,uVar6,100,1000,(uint32_t)in_R9);
      std::
      vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ::push_back(&in_vtt_list,(DASHEventMessageBoxv1 *)&out_meta);
      ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                ((DASHEventMessageBoxv1 *)&out_meta);
      bVar1 = uVar10 < opts.seg_dur_;
      uVar9 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 100);
    } while (bVar1);
  }
  if (opts.send_event_ == true) {
    uVar9 = (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13;
    uVar6 = uVar11 * uVar9;
    if ((uVar12 < uVar2 + uVar6) && (uVar6 - opts.avail_dur_ <= uVar12)) {
      in_R9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)opts.splice_immediate_
      ;
      generate_event_message_splice_insert
                ((DASHEventMessageBoxv1 *)&out_meta,(uint32_t)uVar9,uVar6,opts.avail_dur_,
                 opts.timescale_,opts.splice_immediate_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," === ad slot is active == ",0x1a);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::
      vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ::push_back(&in_emsg_list,(value_type *)&out_meta);
      ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                ((DASHEventMessageBoxv1 *)&out_meta);
    }
    uVar11 = (uVar9 + 1) * uVar11;
    if ((uVar12 < uVar2 + uVar11) && (uVar11 - opts.avail_dur_ <= uVar12)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," == ad slot is active, pushing segment with markers == ",
                 0x37);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      in_R9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)opts.splice_immediate_
      ;
      generate_event_message_splice_insert
                ((DASHEventMessageBoxv1 *)&out_meta,(uint32_t)uVar9 + 1,uVar11,opts.avail_dur_,
                 opts.timescale_,opts.splice_immediate_);
      std::
      vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>
      ::push_back(&in_emsg_list,(value_type *)&out_meta);
      ::event_track::DASHEventMessageBoxv1::~DASHEventMessageBoxv1
                ((DASHEventMessageBoxv1 *)&out_meta);
    }
  }
  uVar11 = uVar8 * number;
  uVar8 = uVar8 + uVar11;
  segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (opts.send_event_ == true) {
    in_R9 = &segment_bytes;
    ::event_track::get_meta_segment_bytes
              (&in_emsg_list,uVar11,uVar8,opts.track_id_,opts.timescale_,in_R9,(uint32_t)number,
               false);
  }
  if (opts.send_vtt_ == true) {
    in_R9 = &vtt_bytes;
    ::event_track::get_meta_segment_bytes
              (&in_vtt_list,uVar11,uVar8,opts.track_id_ + 1,opts.timescale_,in_R9,(uint32_t)number,
               true);
  }
  if (opts.dry_run_ == true) {
    if (opts.send_event_ != false) {
      std::ostream::write(local_230,
                          (long)segment_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::ostream::flush();
    }
    if (opts.send_vtt_ == true) {
      std::ostream::write(local_440[0]._M_local_buf,
                          (long)vtt_bytes.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      std::ostream::flush();
    }
  }
  else {
    if (opts.send_event_ != false) {
      out_meta._M_dataplus._M_p = (pointer)&out_meta.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&out_meta,uri._M_dataplus._M_p,
                 uri._M_dataplus._M_p + uri._M_string_length);
      if (2 < opts.media_string_._M_string_length) {
        std::operator+(&local_778,&opts.url_,"/");
        get_path_from_template
                  (&local_758,&opts.media_string_,&event_track,opts.seg_dur_ * number,number);
        std::operator+(&local_738,&local_778,&local_758);
        std::__cxx11::string::operator=((string *)&uri,(string *)&local_738);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_778,&opts.url_,"/");
        get_path_from_template(&local_758,&opts.init_string_,&event_track,0,0);
        std::operator+(&local_738,&local_778,&local_758);
        std::__cxx11::string::operator=((string *)&out_meta,(string *)&local_738);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"posting event track segment to ",0x1f);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,uri._M_dataplus._M_p,uri._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar5);
      CVar3 = PostCurlIngestConnection::send_curl_post(&uri,&segment_bytes);
      if (CVar3 == CURLE_OK) {
        lVar4 = 0x28;
        pcVar7 = "posted segment with timed metadata bytes";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "error posting segment with webvtt bytes, retry logic not implemented yet",0x48);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting event track init segment to ",0x24);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,out_meta._M_dataplus._M_p,
                            out_meta._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        CVar3 = PostCurlIngestConnection::send_curl_post(&out_meta,&header_bytes);
        if (CVar3 != CURLE_OK) goto LAB_00106d87;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting event track  segment to ",0x20);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,uri._M_dataplus._M_p,uri._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        CVar3 = PostCurlIngestConnection::send_curl_post(&uri,&segment_bytes);
        lVar4 = 0x2c;
        pcVar7 = "retry logic succeeded, segment retransmitted";
        if (CVar3 != CURLE_OK) goto LAB_00106d87;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar4);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_meta._M_dataplus._M_p != &out_meta.field_2) {
        operator_delete(out_meta._M_dataplus._M_p,out_meta.field_2._M_allocated_capacity + 1);
      }
    }
    if (opts.send_vtt_ == true) {
      out_meta._M_dataplus._M_p = (pointer)&out_meta.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&out_meta,uri_vtt._M_dataplus._M_p,
                 uri_vtt._M_dataplus._M_p + uri_vtt._M_string_length);
      if (opts.media_string_._M_string_length != 0) {
        std::operator+(&local_778,&opts.url_,"/");
        get_path_from_template
                  (&local_758,&opts.media_string_,&vtt_track,opts.seg_dur_ * number,number);
        std::operator+(&local_738,&local_778,&local_758);
        std::__cxx11::string::operator=((string *)&uri_vtt,(string *)&local_738);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_778,&opts.url_,"/");
        get_path_from_template(&local_758,&opts.init_string_,&vtt_track,0,0);
        std::operator+(&local_738,&local_778,&local_758);
        std::__cxx11::string::operator=((string *)&out_meta,(string *)&local_738);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_738._M_dataplus._M_p != &local_738.field_2) {
          operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758._M_dataplus._M_p != &local_758.field_2) {
          operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"posting vtt track  segment to ",0x1e);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,uri_vtt._M_dataplus._M_p,uri_vtt._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar5);
      CVar3 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&vtt_bytes);
      if (CVar3 == CURLE_OK) {
        lVar4 = 0x1d;
        pcVar7 = "posted segment with vtt bytes";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "error posting segment with webvtt bytes, retry logic not implemented yet",0x48);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting vtt track  init segment to ",0x23);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,out_meta._M_dataplus._M_p,
                            out_meta._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        CVar3 = PostCurlIngestConnection::send_curl_post(&out_meta,&header_bytes_vtt);
        if (CVar3 != CURLE_OK) goto LAB_00106d87;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"posting vtt track  segment to ",0x1e);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,uri_vtt._M_dataplus._M_p,uri_vtt._M_string_length)
        ;
        std::endl<char,std::char_traits<char>>(poVar5);
        CVar3 = PostCurlIngestConnection::send_curl_post(&uri_vtt,&vtt_bytes);
        lVar4 = 0x30;
        pcVar7 = "retry logic succeeded, vtt segment retransmitted";
        if (CVar3 != CURLE_OK) goto LAB_00106d87;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,lVar4);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out_meta._M_dataplus._M_p != &out_meta.field_2) {
        operator_delete(out_meta._M_dataplus._M_p,out_meta.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vtt_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vtt_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vtt_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(segment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)segment_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)segment_bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  ~vector(&in_vtt_list);
  std::
  vector<event_track::DASHEventMessageBoxv1,_std::allocator<event_track::DASHEventMessageBoxv1>_>::
  ~vector(&in_emsg_list);
  uVar9 = number;
  goto LAB_00106011;
}

Assistant:

int main(int argc, char* argv[])
{
    push_marker_options_t opts;
    opts.parse_options(argc, argv);

    if (!opts.send_event_ && !opts.send_vtt_) 
    {
        std::cout << "not configured to send event track or vtt track, use option --vtt when setting option --no_event" << std::endl;
        return 0;
    }
    
    uint64_t last_K = 0;
    std::string uri = opts.url_ + "/Streams(out_meta.cmfm)";
    std::string uri_vtt = opts.url_ + "/Streams(out_vtt.cmft)";
    // ad break and event characteristics
   
    uint64_t last_L = 0;
    uint64_t next_L = 0;

    std::string event_track = "events";
    std::string vtt_track = "vtt_time";

    std::fstream oft(event_track + ".cmfm" , std::ios::binary | std::ios::out);
    std::fstream oft_vtt(vtt_track + ".cmft", std::ios::binary | std::ios::out);

    std::vector<uint8_t> header_bytes;
    std::vector<uint8_t> header_bytes_vtt;

    if(opts.send_event_)
        event_track::get_meta_header_bytes(opts.track_id_, opts.timescale_, header_bytes, false);
    if(opts.send_vtt_)
        event_track::get_meta_header_bytes(opts.track_id_ + 1, opts.timescale_, header_bytes_vtt, true);
    
    if (opts.dry_run_) {
        if(opts.send_event_)
            oft.write((const char*)&header_bytes[0], header_bytes.size());
        if(opts.send_vtt_)
            oft_vtt.write((const char*)&header_bytes_vtt[0], header_bytes_vtt.size());
    }
    else {
        if (opts.send_event_)
            if (opts.init_string_.size() < 2) {
                std::cout << "posting event segment to: " << uri << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri, header_bytes) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
            else 
            {
                std::string out_meta = "events";
                uri = opts.url_ + "/" + get_path_from_template(opts.init_string_, out_meta, 0, 0);
                std::cout << "posting event segment to: " << uri << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri, header_bytes) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
        if (opts.send_vtt_)
            if (opts.init_string_.size() < 2) {
                std::cout << "posting 'vttt segment to: " << uri_vtt << std::endl;
                if (PostCurlIngestConnection::send_curl_post(uri_vtt, header_bytes_vtt) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
            else {
               
                std::cout << "posting 'vttt segment to: " << uri_vtt << std::endl;
                uri_vtt = opts.url_ + "/" + get_path_from_template(opts.init_string_, vtt_track, 0, 0);

                if (PostCurlIngestConnection::send_curl_post(uri_vtt, header_bytes_vtt) != CURLcode::CURLE_OK)
                    std::exit(1);
            }
    }
    while (1) {
        auto t = std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::system_clock::now().time_since_epoch()).count();
        //std::time_t t = std::time(0);  // t is an integer type
        uint64_t t_d = (uint64_t)t + opts.announce_;

        uint64_t next_K =  (uint64_t) std::ceil( t_d / (double) opts.seg_dur_ ); // calculate the next segment boundary
        last_L = (uint64_t)std::floor( t_d / (double) opts.avail_interval_);
        
        // the previous/current ad break (probably already ended) 
        uint64_t ad_start_last = last_L * opts.avail_interval_ ;
        uint64_t ad_end_last = ad_start_last + opts.avail_dur_ ;

        // the next ad break to announce
        uint64_t ad_start_next = (last_L + 1) * opts.avail_interval_;
        uint64_t ad_end_next = ad_start_next + opts.avail_dur_ ;

        if (next_K != last_K) {
            // fixed timescale 1000 and milliseconds based durations
            uint64_t seg_start = (uint64_t) ( next_K * opts.seg_dur_ );
            uint64_t seg_end = (uint64_t)   ( opts.seg_dur_ + seg_start);

            std::cout << " next_K is : " << next_K << std::endl;
            // std::cout << "next segment boundary is after: " << next_K * opts.seg_dur_  - t_d << " milliseconds" << std::endl;
            // std::cout << "previous tfdt was  " << t_d - last_K * opts.seg_dur_  << "  milli seconds ago" << std::endl;
            
            last_K = next_K;

            std::vector<event_track::DASHEventMessageBoxv1> in_emsg_list;
            std::vector<event_track::DASHEventMessageBoxv1> in_vtt_list;
            
            if (opts.send_vtt_) {
                
                for (unsigned int off = 0; off < opts.seg_dur_; off += 100) 
                {
                    auto ev_vtt = generate_event_message_vtt_time(
                        (uint32_t) (next_K * opts.seg_dur_ + off),
                        (uint64_t)next_K * opts.seg_dur_ + off,
                        (uint64_t)100,
                        (uint32_t)1000,
                        off
                    );

                    in_vtt_list.push_back(ev_vtt);
                }
            }
            if (opts.send_event_) {
                if (t_d < ad_end_last && t_d >= ad_start_last - opts.avail_dur_)
                {

                    auto ev = generate_event_message_splice_insert(
                        (uint32_t)last_L,
                        (uint64_t)ad_start_last,
                        (uint64_t)opts.avail_dur_,
                        (uint32_t)opts.timescale_,
                        opts.splice_immediate_
                    );
                    std::cout << " === ad slot is active == " << std::endl;

                    in_emsg_list.push_back(ev);
                }

                if (t_d < ad_end_next && t_d >= ad_start_next - opts.avail_dur_)
                {
                    std::cout << " == ad slot is active, pushing segment with markers == " << std::endl;

                    auto ev = generate_event_message_splice_insert(
                        (uint32_t)last_L + 1,
                        (uint64_t)ad_start_next,
                        (uint64_t)opts.avail_dur_,
                        opts.timescale_,
                        opts.splice_immediate_
                    );
                    // ev.print();

                    in_emsg_list.push_back(ev);
                }
            }
            std::vector<uint8_t> segment_bytes;
            std::vector<uint8_t> vtt_bytes;

            if (opts.send_event_) {
                event_track::get_meta_segment_bytes(
                    in_emsg_list,
                    seg_start,
                    seg_end,
                    opts.track_id_,
                    opts.timescale_,
                    segment_bytes,
                    (uint32_t)next_K,
                    false
                );
            }

            if (opts.send_vtt_) {
                event_track::get_meta_segment_bytes(
                    in_vtt_list,
                    seg_start,
                    seg_end,
                    opts.track_id_ + 1,
                    opts.timescale_,
                    vtt_bytes,
                    (uint32_t)next_K,
                    true
                );
            }

            // in case of dry run just write the output files
            if (opts.dry_run_) {
                if (opts.send_event_) {
                    oft.write((const char*)&segment_bytes[0], segment_bytes.size());
                    oft.flush();
                }
                if (opts.send_vtt_) {
                    oft_vtt.write((const char*)&vtt_bytes[0], vtt_bytes.size());
                    oft_vtt.flush();
                }
            }
            else {
                if (opts.send_event_) {
                    
                    std::string uri_h = uri;
                    
                    if (opts.media_string_.size() > 2) 
                    {  
                        uri = opts.url_ + "/" + get_path_from_template(opts.media_string_, event_track, next_K * opts.seg_dur_, next_K);
                        uri_h = opts.url_ + "/" + get_path_from_template(opts.init_string_, event_track, 0, 0);
                    }

                    std::cout << "posting event track segment to " << uri << std::endl;
                    if (PostCurlIngestConnection::send_curl_post(uri, segment_bytes) == CURLcode::CURLE_OK)
                        std::cout << ("posted segment with timed metadata bytes") << std::endl;
                    
                    else {
                        std::cout << ("error posting segment with webvtt bytes, retry logic not implemented yet") << std::endl;

                        std::cout << "posting event track init segment to " << uri_h << std::endl;
                        if (PostCurlIngestConnection::send_curl_post(uri_h, header_bytes) != CURLcode::CURLE_OK) {
                            std::exit(1);
                        }
                        else {
                            std::cout << "posting event track  segment to " << uri << std::endl;
                            if (PostCurlIngestConnection::send_curl_post(uri, segment_bytes) == CURLcode::CURLE_OK)
                                std::cout << "retry logic succeeded, segment retransmitted" << std::endl;
                            else
                                std::exit(1);
                        }
                    }
                }
                if (opts.send_vtt_) {

                    std::string uri_vtt_h = uri_vtt;

                    if (opts.media_string_.size() > 0)
                    {
                        uri_vtt = opts.url_ + "/" + get_path_from_template(opts.media_string_, vtt_track, next_K * opts.seg_dur_, next_K);
                        uri_vtt_h = opts.url_ + "/" + get_path_from_template(opts.init_string_, vtt_track, 0, 0);
                    }
                    std::cout << "posting vtt track  segment to " << uri_vtt << std::endl;
                    if (PostCurlIngestConnection::send_curl_post(uri_vtt, vtt_bytes) == CURLcode::CURLE_OK)
                        std::cout << ("posted segment with vtt bytes") << std::endl;
                    else {
                        std::cout << ("error posting segment with webvtt bytes, retry logic not implemented yet") << std::endl;
                
                        std::cout << "posting vtt track  init segment to " << uri_vtt_h << std::endl;
                        if (PostCurlIngestConnection::send_curl_post(uri_vtt_h, header_bytes_vtt) != CURLcode::CURLE_OK) {
                            std::exit(1);
                        }
                        else {
                            std::cout << "posting vtt track  segment to " << uri_vtt << std::endl;
                            if (PostCurlIngestConnection::send_curl_post(uri_vtt, vtt_bytes) == CURLcode::CURLE_OK) {
                                std::cout << "retry logic succeeded, vtt segment retransmitted" << std::endl;
                            }
                            else {
                                std::exit(1);
                            }
                        }
                    }
                }
            }
        }
    }
    std::exit(1);
}